

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O0

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  void *extraout_RAX;
  void *extraout_RAX_00;
  undefined4 in_register_00000034;
  string *str;
  BufferReader *this_00;
  BufferReader *this_01;
  undefined1 local_1;
  
  str = (string *)CONCAT44(in_register_00000034,__fd);
  if ((void *)this->bytesRemaining_ < __buf) {
    local_1 = 0;
  }
  else {
    this_00 = (BufferReader *)__buf;
    this_01 = this;
    pvVar1 = (void *)chunkRemaining((BufferReader *)__buf);
    if (pvVar1 < __buf) {
      slowStringRead(this_01,str,(size_type)this_00);
      __buf = extraout_RAX_00;
    }
    else {
      fastStringRead(this_00,(string *)this,(size_type)__buf);
      __buf = extraout_RAX;
    }
    local_1 = 1;
  }
  return CONCAT71((int7)((ulong)__buf >> 8),local_1);
}

Assistant:

bool read(std::string &str, size_type size) { 
        if(size > bytesRemaining_) {
            return false;
        }

        if(size <= chunkRemaining()) {
            fastStringRead(str, size);
        }
        else {
            slowStringRead(str, size);
        }

        return true;
    }